

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O2

void __thiscall
cmDebugger::cmDebuggerVariables::cmDebuggerVariables
          (cmDebuggerVariables *this,
          shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager,string *name,
          bool supportsVariableType,
          function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
          *getKeyValuesFunction)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this->_vptr_cmDebuggerVariables = (_func_int **)&PTR_HandleVariablesRequest_00935260;
  LOCK();
  UNLOCK();
  lVar3 = NextId + 1;
  this->Id = NextId;
  NextId = lVar3;
  std::__cxx11::string::string((string *)&this->Name,(string *)name);
  (this->Value)._M_dataplus._M_p = (pointer)&(this->Value).field_2;
  (this->Value)._M_string_length = 0;
  (this->Value).field_2._M_local_buf[0] = '\0';
  std::
  function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
  ::function(&this->GetKeyValuesFunction,getKeyValuesFunction);
  *(undefined8 *)
   ((long)&(this->SubVariables).
           super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->SubVariables).
           super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->SubVariables).
  super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SubVariables).
  super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->EnableSorting = true;
  this->SupportsVariableType = supportsVariableType;
  (this->VariablesManager).
  super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (variablesManager->
           super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (variablesManager->
           super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (variablesManager->
  super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->VariablesManager).
  super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->VariablesManager).
  super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var2;
  (variablesManager->
  super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDebuggerVariables.cxx:56:9)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDebuggerVariables.cxx:56:9)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  cmDebuggerVariablesManager::RegisterHandler
            ((this->VariablesManager).
             super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,this->Id,
             (function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>
              *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return;
}

Assistant:

cmDebuggerVariables::cmDebuggerVariables(
  std::shared_ptr<cmDebuggerVariablesManager> variablesManager,
  std::string name, bool supportsVariableType,
  std::function<std::vector<cmDebuggerVariableEntry>()> getKeyValuesFunction)
  : Id(NextId.fetch_add(1))
  , Name(std::move(name))
  , GetKeyValuesFunction(std::move(getKeyValuesFunction))
  , SupportsVariableType(supportsVariableType)
  , VariablesManager(std::move(variablesManager))
{
  VariablesManager->RegisterHandler(
    Id, [this](dap::VariablesRequest const& request) {
      (void)request;
      return this->HandleVariablesRequest();
    });
}